

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_sqlite3.c
# Opt level: O1

uint64_t mm_sql_read_uint64(void *db,char *sql)

{
  FILE *__stream;
  int iVar1;
  uint64_t uVar2;
  char *pcVar3;
  sqlite3_stmt *res;
  sqlite3_stmt *local_20;
  
  local_20 = (sqlite3_stmt *)0x0;
  iVar1 = sqlite3_prepare_v2((sqlite3 *)db,sql,-1,&local_20,(char **)0x0);
  __stream = _stderr;
  if (iVar1 == 0) {
    sqlite3_step(local_20);
    uVar2 = sqlite3_column_int64(local_20,0);
  }
  else {
    pcVar3 = sqlite3_errmsg((sqlite3 *)db);
    fprintf(__stream,"%s: Failed to prepare: \nSQL: \'%s\'\nError: %s","mm_sql_read_uint64",sql,
            pcVar3);
    uVar2 = 0xffffffffffffffff;
  }
  sqlite3_finalize(local_20);
  return uVar2;
}

Assistant:

uint64_t mm_sql_read_uint64(void* db, const char* sql) {
    sqlite3_stmt* res = NULL;
    uint64_t val = 0L;
    int rc = sqlite3_prepare_v2((sqlite3*)db, sql, -1, &res, 0);

    if (rc != SQLITE_OK) {
        fprintf(stderr, "%s: Failed to prepare: \nSQL: '%s'\nError: %s", __func__, sql, sqlite3_errmsg((sqlite3 *)(db)));
        sqlite3_finalize(res);
        return 0xFFFFFFFFFFFFFFFFLL;
    }

    sqlite3_step(res);

    val = (uint64_t)sqlite3_column_int64(res, 0);

    sqlite3_finalize(res);

    return (val);
}